

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.cpp
# Opt level: O0

int __thiscall
btDbvt::clone(btDbvt *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  bool bVar1;
  int iVar2;
  btDbvt *pdbvt;
  btDbvt *extraout_RAX;
  btDbvtNode *n;
  sStkCLN e;
  int i;
  btAlignedObjectArray<btDbvt::sStkCLN> stack;
  void *in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  btDbvtNode *in_stack_ffffffffffffff38;
  btAlignedObjectArray<btDbvt::sStkCLN> *in_stack_ffffffffffffff40;
  sStkCLN local_a0;
  sStkCLN local_90;
  btDbvtNode *local_80;
  btDbvtNode *local_78;
  btDbvtNode *pbStack_70;
  uint local_5c;
  sStkCLN local_58 [2];
  btAlignedObjectArray<btDbvt::sStkCLN> local_38;
  long *local_18;
  __fn *local_10;
  btDbvt *local_8;
  
  local_18 = (long *)__child_stack;
  local_10 = __fn;
  local_8 = this;
  clear((btDbvt *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  if (this->m_root != (btDbvtNode *)0x0) {
    btAlignedObjectArray<btDbvt::sStkCLN>::btAlignedObjectArray
              ((btAlignedObjectArray<btDbvt::sStkCLN> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    btAlignedObjectArray<btDbvt::sStkCLN>::reserve
              (in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    sStkCLN::sStkCLN(local_58,this->m_root,(btDbvtNode *)0x0);
    btAlignedObjectArray<btDbvt::sStkCLN>::push_back
              (in_stack_ffffffffffffff40,(sStkCLN *)in_stack_ffffffffffffff38);
    do {
      iVar2 = btAlignedObjectArray<btDbvt::sStkCLN>::size(&local_38);
      local_5c = iVar2 - 1;
      pdbvt = (btDbvt *)btAlignedObjectArray<btDbvt::sStkCLN>::operator[](&local_38,local_5c);
      local_78 = pdbvt->m_root;
      pbStack_70 = pdbvt->m_free;
      in_stack_ffffffffffffff38 =
           createnode(pdbvt,in_stack_ffffffffffffff38,
                      (btDbvtVolume *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                      in_stack_ffffffffffffff28);
      local_80 = in_stack_ffffffffffffff38;
      btAlignedObjectArray<btDbvt::sStkCLN>::pop_back(&local_38);
      if (pbStack_70 == (btDbvtNode *)0x0) {
        *(btDbvtNode **)local_10 = local_80;
      }
      else {
        *(btDbvtNode **)((long)(&pbStack_70->volume + 1) + ((long)(int)(local_5c & 1) + 1) * 8) =
             local_80;
      }
      bVar1 = btDbvtNode::isinternal((btDbvtNode *)0x15e672);
      in_stack_ffffffffffffff34 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff34);
      if (bVar1) {
        sStkCLN::sStkCLN(&local_90,(local_78->field_2).childs[0],local_80);
        btAlignedObjectArray<btDbvt::sStkCLN>::push_back
                  ((btAlignedObjectArray<btDbvt::sStkCLN> *)pdbvt,
                   (sStkCLN *)in_stack_ffffffffffffff38);
        sStkCLN::sStkCLN(&local_a0,(local_78->field_2).childs[1],local_80);
        btAlignedObjectArray<btDbvt::sStkCLN>::push_back
                  ((btAlignedObjectArray<btDbvt::sStkCLN> *)pdbvt,
                   (sStkCLN *)in_stack_ffffffffffffff38);
      }
      else {
        (**(code **)(*local_18 + 0x10))(local_18,local_80);
      }
      in_stack_ffffffffffffff30 = btAlignedObjectArray<btDbvt::sStkCLN>::size(&local_38);
    } while (0 < in_stack_ffffffffffffff30);
    btAlignedObjectArray<btDbvt::sStkCLN>::~btAlignedObjectArray
              ((btAlignedObjectArray<btDbvt::sStkCLN> *)0x15e729);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

void			btDbvt::clone(btDbvt& dest,IClone* iclone) const
{
	dest.clear();
	if(m_root!=0)
	{	
		btAlignedObjectArray<sStkCLN>	stack;
		stack.reserve(m_leaves);
		stack.push_back(sStkCLN(m_root,0));
		do	{
			const int		i=stack.size()-1;
			const sStkCLN	e=stack[i];
			btDbvtNode*			n=createnode(&dest,e.parent,e.node->volume,e.node->data);
			stack.pop_back();
			if(e.parent!=0)
				e.parent->childs[i&1]=n;
			else
				dest.m_root=n;
			if(e.node->isinternal())
			{
				stack.push_back(sStkCLN(e.node->childs[0],n));
				stack.push_back(sStkCLN(e.node->childs[1],n));
			}
			else
			{
				iclone->CloneLeaf(n);
			}
		} while(stack.size()>0);
	}
}